

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void pstore::create_log_stream(string *ident)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  *this;
  _Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  _Var4;
  pointer *__ptr;
  new_allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_> *this_00;
  logger *plVar5;
  size_type __n;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar6;
  undefined8 *puVar7;
  pointer *__ptr_1;
  undefined8 *puVar8;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *__cur;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar9;
  long *in_FS_OFFSET;
  __single_object loggers;
  _Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  local_38;
  
  this_00 = (new_allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_> *
            )operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  local_38._M_head_impl =
       (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
        *)this_00;
  std::
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  ::reserve((vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             *)this_00,1);
  plVar5 = (logger *)operator_new(0x68);
  (plVar5->buffer_)._M_dataplus._M_p = (pointer)&(plVar5->buffer_).field_2;
  (plVar5->buffer_)._M_string_length = 0;
  (plVar5->buffer_).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&plVar5->priority_ = 0x800000007;
  plVar5->_vptr_logger = (_func_int **)&PTR__logger_0023d9c0;
  plVar5[1]._vptr_logger = (_func_int **)0x0;
  plVar5[1].buffer_._M_dataplus._M_p = (pointer)0x0;
  plVar5[1].buffer_._M_string_length = 0;
  plVar5[1].buffer_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&plVar5[1].buffer_.field_2 + 8) = 0;
  *(undefined8 *)&plVar5[1].priority_ = 0;
  *(undefined2 *)&plVar5[2]._vptr_logger = 0;
  strncpy((char *)(plVar5 + 1),(ident->_M_dataplus)._M_p,0x31);
  *(undefined1 *)((long)&plVar5[2]._vptr_logger + 1) = 0;
  openlog((char *)(plVar5 + 1),1,8);
  puVar8 = *(undefined8 **)(this_00 + 8);
  if (puVar8 == *(undefined8 **)(this_00 + 0x10)) {
    __n = std::
          vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
          ::_M_check_len((vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                          *)this_00,1,"vector::_M_realloc_insert");
    puVar1 = *(undefined8 **)this_00;
    puVar2 = *(undefined8 **)(this_00 + 8);
    if (__n == 0) {
      puVar6 = (unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *)0x0;
    }
    else {
      puVar6 = __gnu_cxx::
               new_allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>
               ::allocate(this_00,__n,(void *)0x0);
    }
    puVar6[(long)puVar8 - (long)puVar1 >> 3]._M_t.
    super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>._M_t.
    super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
    super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl = plVar5;
    puVar9 = puVar6;
    for (puVar7 = puVar1; puVar7 != puVar8; puVar7 = puVar7 + 1) {
      (puVar9->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl = (logger *)*puVar7;
      *puVar7 = 0;
      puVar9 = puVar9 + 1;
    }
    for (; puVar9 = puVar9 + 1, puVar2 != puVar8; puVar8 = puVar8 + 1) {
      (puVar9->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl = (logger *)*puVar8;
      *puVar8 = 0;
    }
    if (puVar1 != (undefined8 *)0x0) {
      operator_delete(puVar1,*(long *)(this_00 + 0x10) - (long)puVar1);
    }
    *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)this_00 = puVar6;
    *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)(this_00 + 8) = puVar9;
    *(unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> **)(this_00 + 0x10) =
         puVar6 + __n;
  }
  else {
    *puVar8 = plVar5;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  lVar3 = *in_FS_OFFSET;
  this = *(vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
           **)(lVar3 + -8);
  if (this != (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
               *)0x0) {
    std::
    vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    ::~vector(this);
  }
  operator_delete(this,0x18);
  _Var4._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl =
       (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
        *)0x0;
  *(vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    **)(lVar3 + -8) = _Var4._M_head_impl;
  std::
  unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                 *)&local_38);
  return;
}

Assistant:

void create_log_stream (std::string const & ident) {
            std::bitset<handlers::last> enabled;

#ifdef PSTORE_HAVE_OSLOG_H
            enabled.set (handlers::asl);
#elif defined(PSTORE_HAVE_SYS_LOG_H)
            enabled.set (handlers::syslog);
#else
            // TODO: At the moment, I just log to stderr unless syslog() or ASL are available.
            // Consider offering an option to the user to control the logging destination and
            // whether to use file-base logging.
            enabled.set (handlers::standard_error);
#endif

            auto loggers = std::make_unique<details::logger_collection> ();
            loggers->reserve (enabled.count ());

#ifdef PSTORE_HAVE_OSLOG_H
            if (enabled.test (handlers::asl)) {
                loggers->emplace_back (new asl_logger (ident));
            }
#endif
#ifdef PSTORE_HAVE_SYS_LOG_H
            if (enabled.test (handlers::syslog)) {
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                loggers->emplace_back (new syslog_logger (ident, LOG_USER));
            }
#endif

            if (enabled.test (handlers::rotating_file)) {
                constexpr auto max_size = std::streamoff{1024 * 1024};
                constexpr auto num_backups = 10U;
                loggers->emplace_back (new rotating_log (ident + ".log", max_size, num_backups));
            }

            if (enabled.test (handlers::standard_error)) {
                loggers->emplace_back (new stderr_logger);
            }

            using details::log_destinations;
            delete log_destinations;
            log_destinations = loggers.release ();
        }